

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpbrk.c
# Opt level: O2

char * strpbrk(char *__s,char *__accept)

{
  char cVar1;
  char *pcVar2;
  char *p1;
  
  do {
    pcVar2 = __accept;
    if (*__s == '\0') {
      return (char *)0x0;
    }
    while (cVar1 = *pcVar2, cVar1 != '\0') {
      pcVar2 = pcVar2 + 1;
      if (*__s == cVar1) {
        return __s;
      }
    }
    __s = __s + 1;
  } while( true );
}

Assistant:

char * strpbrk( const char * s1, const char * s2 )
{
    const char * p1 = s1;
    const char * p2;

    while ( *p1 )
    {
        p2 = s2;

        while ( *p2 )
        {
            if ( *p1 == *p2++ )
            {
                return ( char * ) p1;
            }
        }

        ++p1;
    }

    return NULL;
}